

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O3

void Js::JavascriptExceptionOperators::AddStackTraceToObject
               (Var targetObject,StackTrace *stackTrace,ScriptContext *scriptContext,
               bool isThrownException,bool resetStack)

{
  JavascriptFunction *setter;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  RecyclableObject *obj;
  undefined1 local_68 [8];
  PropertyDescriptor stackPropertyDescriptor;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if ((stackTrace != (StackTrace *)0x0) &&
     (((scriptContext->config).threadConfig)->m_errorStackTrace == true)) {
    if (((stackTrace->
         super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
         ).count == 0) && (bVar2 = IsErrorInstance(targetObject), !bVar2)) {
      return;
    }
    if (isThrownException) {
      if (((DAT_015bc474 == '\x01') && (scriptContext->threadContext->hasCatchHandler == false)) &&
         (stackTrace = TrimStackTraceForThrownObject(stackTrace,targetObject,scriptContext),
         stackTrace == (StackTrace *)0x0)) {
        return;
      }
      bVar2 = IsErrorInstance(targetObject);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                           ,0x5d8,"(!isThrownException || IsErrorInstance(targetObject))",
                           "!isThrownException || IsErrorInstance(targetObject)");
        if (!bVar2) goto LAB_00a96774;
        *puVar5 = 0;
      }
    }
    obj = VarTo<Js::RecyclableObject>(targetObject);
    if ((!resetStack) &&
       (iVar3 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0xb])(obj,0x161,0), iVar3 == 1)) {
      return;
    }
    setter = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).stackTraceAccessorFunction.ptr;
    PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_68);
    PropertyDescriptor::SetSetter((PropertyDescriptor *)local_68,setter);
    PropertyDescriptor::SetGetter((PropertyDescriptor *)local_68,setter);
    PropertyDescriptor::SetConfigurable((PropertyDescriptor *)local_68,true);
    PropertyDescriptor::SetEnumerable((PropertyDescriptor *)local_68,false);
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)&stackPropertyDescriptor.field_0x2c,
               ExceptionType_JavascriptException|ExceptionType_StackOverflow|
               ExceptionType_OutOfMemory);
    BVar4 = JavascriptOperators::DefineOwnPropertyDescriptor
                      (obj,0x161,(PropertyDescriptor *)local_68,false,scriptContext,
                       PropertyOperation_None);
    if (BVar4 != 0) {
      (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
        [0x19])(obj,5,stackTrace,0,0);
      (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
        [0x19])(obj,6,0,0,0);
    }
    BVar4 = JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                         ,0x5ef,"(JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext())",
                         "JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext()");
      if (!bVar2) {
LAB_00a96774:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)&stackPropertyDescriptor.field_0x2c);
  }
  return;
}

Assistant:

void JavascriptExceptionOperators::AddStackTraceToObject(Var targetObject, JavascriptExceptionContext::StackTrace* stackTrace, ScriptContext& scriptContext, bool isThrownException, bool resetStack)
    {
        if (!stackTrace || !scriptContext.GetConfig()->IsErrorStackTraceEnabled())
        {
            return;
        }

        if (stackTrace->Count() == 0 && !IsErrorInstance(targetObject))
        {
            return;
        }

        if (isThrownException && CrawlStackForWER(scriptContext)) // Trim stack trace for WER
        {
            stackTrace = TrimStackTraceForThrownObject(stackTrace, targetObject, scriptContext);
            if (!stackTrace)
            {
                return;
            }
        }

        // If we still have stack trace to store and obj is a thrown exception object, obj must be an Error instance.
        Assert(!isThrownException || IsErrorInstance(targetObject));

        RecyclableObject* obj = VarTo<RecyclableObject>(targetObject);
        if (!resetStack && obj->HasProperty(PropertyIds::stack))
        {
            return; // we don't want to overwrite an existing "stack" property
        }

        JavascriptFunction* accessor = scriptContext.GetLibrary()->GetStackTraceAccessorFunction();
        PropertyDescriptor stackPropertyDescriptor;
        stackPropertyDescriptor.SetSetter(accessor);
        stackPropertyDescriptor.SetGetter(accessor);
        stackPropertyDescriptor.SetConfigurable(true);
        stackPropertyDescriptor.SetEnumerable(false);
        HRESULT hr;
        BEGIN_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT_NESTED
        {
            if (JavascriptOperators::DefineOwnPropertyDescriptor(obj, PropertyIds::stack, stackPropertyDescriptor, false, &scriptContext))
            {
                obj->SetInternalProperty(InternalPropertyIds::StackTrace, stackTrace, PropertyOperationFlags::PropertyOperation_None, NULL);
                obj->SetInternalProperty(InternalPropertyIds::StackTraceCache, NULL, PropertyOperationFlags::PropertyOperation_None, NULL);
            }
        }
        END_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT_INSCRIPT(hr)
    }